

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithmeticSubtermGeneralization.cpp
# Opt level: O1

Result Inferences::
       generalizeBottomUp<Inferences::EvaluatePolynom<Inferences::AdditionGeneralizationImpl::Generalize>>
                 (Clause *cl,
                 EvaluatePolynom<Inferences::AdditionGeneralizationImpl::Generalize> eval)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  Result RVar4;
  Inference inf;
  undefined1 local_aa [2];
  Stack<Kernel::Literal_*> local_a8;
  EvaluateMonom<Inferences::NumeralMultiplicationGeneralizationImpl::Generalize> *local_88;
  bool *pbStack_80;
  SplitSet *local_78;
  anon_class_8_1_54a39801_for__func aStack_70;
  void *local_68;
  float fStack_60;
  float fStack_5c;
  SimplifyingInference1 local_58;
  EvaluateMonom<Inferences::NumeralMultiplicationGeneralizationImpl::Generalize> *local_48;
  bool *pbStack_40;
  SplitSet *local_38;
  Clause *pCStack_30;
  void *local_28;
  undefined8 uStack_20;
  
  pbStack_80 = (bool *)(local_aa + 1);
  local_aa[1] = 0;
  local_78 = (SplitSet *)local_aa;
  local_aa[0] = 1;
  fStack_60 = (float)(*(uint *)&cl->field_0x38 & 0xfffff);
  local_88 = (EvaluateMonom<Inferences::NumeralMultiplicationGeneralizationImpl::Generalize> *)&eval
  ;
  local_68 = (void *)0x0;
  aStack_70.a = cl;
  ::Lib::
  IterTraits<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:90:10),_Kernel::Literal_*>_>
  ::collect<Lib::Stack>
            (&local_a8,
             (IterTraits<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:90:10),_Kernel::Literal_*>_>
              *)&local_88);
  local_58.rule = ARITHMETIC_SUBTERM_GENERALIZATION;
  local_58.premise = cl;
  Kernel::Inference::Inference((Inference *)&local_88,&local_58);
  lVar1 = DAT_00b7e1c0;
  bVar3 = local_aa[1] & local_aa[0];
  *(int *)(DAT_00b7e1c0 + 0x17c) = *(int *)(DAT_00b7e1c0 + 0x17c) + 1;
  if (bVar3 == 0) {
    *(int *)(lVar1 + 0x178) = *(int *)(lVar1 + 0x178) + 1;
  }
  uStack_20._4_4_ = fStack_5c;
  uStack_20._0_4_ = fStack_60;
  local_28 = local_68;
  local_38 = local_78;
  pCStack_30 = aStack_70.a;
  local_48 = local_88;
  pbStack_40 = pbStack_80;
  RVar4.simplified = Kernel::Clause::fromStack(&local_a8,(Inference *)&local_48);
  if (local_a8._stack != (Literal **)0x0) {
    uVar2 = local_a8._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      *local_a8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_a8._stack;
    }
    else if (uVar2 < 0x11) {
      *local_a8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_a8._stack;
    }
    else if (uVar2 < 0x19) {
      *local_a8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_a8._stack;
    }
    else if (uVar2 < 0x21) {
      *local_a8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_a8._stack;
    }
    else if (uVar2 < 0x31) {
      *local_a8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_a8._stack;
    }
    else if (uVar2 < 0x41) {
      *local_a8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_a8._stack;
    }
    else {
      operator_delete(local_a8._stack,0x10);
    }
  }
  RVar4._8_8_ = CONCAT71((int7)((ulong)cl >> 8),bVar3) & 0xffffffff;
  return RVar4;
}

Assistant:

SimplifyingGeneratingInference1::Result generalizeBottomUp(Clause* cl, EvalFn eval) 
{
  /* apply the selectedGen generalization */
  DEBUG_CODE(bool anyChange = false);
  bool oneLess = false;
  bool allLessEq = true;

  auto stack = iterTraits(cl->iterLits())
    .map([&](Literal* lit) -> Literal* {
        unsigned j = 0;
        auto termArgs = termArgIter(lit)
          .map([&](TermList term) -> TermList { 
              auto norm = PolyNf::normalize(TypedTermList(term, SortHelper::getTermArgSort(lit, j++)));
              auto res = BottomUpEvaluation<typename EvalFn::Arg, typename EvalFn::Result>().function(eval).apply(norm);
              if (res != norm) {
                DEBUG_CODE(anyChange = true);
                DEBUG("generalized: ", norm, " -> ", res);
                return res.denormalize();
              } else {
                return term;
              }
          });
        auto args = concatIters(typeArgIter(lit), termArgs)
              .template collect<Stack>();

        auto generalizedLit = Literal::create(
            lit, 
            args.begin());

        if (eval.eval.doOrderingCheck) {

          auto ord = Ordering::tryGetGlobalOrdering();
          ASS(ord)
          auto cmp = ord->compare(generalizedLit, lit);
          switch(cmp) {
            case Ordering::LESS:
              oneLess = true;
              break;
            case Ordering::EQUAL:
              break;
            case Ordering::GREATER:
            case Ordering::INCOMPARABLE:
              allLessEq = false;
              DEBUG("ordering violation: ", cmp)
              DEBUG("original   : ", *lit)
              DEBUG("generalized: ", *generalizedLit)
              break;
          }
        }
        return generalizedLit;
    })
    .template collect<Stack>();

  ASS(anyChange)
  Inference inf(SimplifyingInference1(Kernel::InferenceRule::ARITHMETIC_SUBTERM_GENERALIZATION, cl));
  bool redundant = allLessEq && oneLess;
  env.statistics->asgCnt++;
  if (!redundant) {
    env.statistics->asgViolations++;
  }
  return SimplifyingGeneratingInference1::Result{
    .simplified = Clause::fromStack(stack, inf), 
    .premiseRedundant = redundant
  };
}